

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

DescriptorPool * google::protobuf::DescriptorPool::internal_generated_pool(void)

{
  int iVar1;
  DescriptorPool *this;
  EncodedDescriptorDatabase *fallback_database;
  
  if (internal_generated_pool()::generated_pool == '\0') {
    iVar1 = __cxa_guard_acquire(&internal_generated_pool()::generated_pool);
    if (iVar1 != 0) {
      this = (DescriptorPool *)operator_new(0x60);
      fallback_database = anon_unknown_1::GeneratedDatabase();
      DescriptorPool(this,&fallback_database->super_DescriptorDatabase,(ErrorCollector *)0x0);
      this->enforce_dependencies_ = false;
      this->lazily_build_dependencies_ = true;
      internal_generated_pool::generated_pool =
           internal::OnShutdownDelete<google::protobuf::DescriptorPool>(this);
      __cxa_guard_release(&internal_generated_pool()::generated_pool);
    }
  }
  return internal_generated_pool::generated_pool;
}

Assistant:

DescriptorPool* DescriptorPool::internal_generated_pool() {
  static DescriptorPool* generated_pool =
      internal::OnShutdownDelete(NewGeneratedPool());
  return generated_pool;
}